

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O2

int_type __thiscall
spvtools::utils::
HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
::getUnbiasedNormalizedExponent
          (HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
           *this)

{
  uint uVar1;
  int iVar2;
  uint_type significand_bits;
  uint uVar3;
  
  uVar3 = (this->value_).data_;
  if ((uVar3 & 0x7fffffff) == 0) {
    iVar2 = 0;
  }
  else {
    uVar1 = uVar3 >> 0x17 & 0xff;
    if (uVar1 != 0) {
      return uVar1 - 0x7f;
    }
    iVar2 = -0x7f;
    for (; (uVar3 >> 0x16 & 1) == 0; uVar3 = uVar3 * 2) {
      iVar2 = iVar2 + -1;
    }
  }
  return iVar2;
}

Assistant:

uint_type data() const { return data_; }